

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O3

vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
find_database_file_abi_cxx11_(void)

{
  pointer pcVar1;
  source_loc loc;
  undefined8 this;
  bool bVar2;
  int iVar3;
  path *file;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *in_RDI;
  directory_iterator __begin1;
  directory_iterator local_c8;
  directory_iterator local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_80 [40];
  path local_58;
  
  if (spdlog::details::registry::instance()::s_instance == '\0') {
    iVar3 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
    if (iVar3 != 0) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
  }
  local_a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
  ;
  local_a8._8_4_ = 0xf4;
  local_98._M_allocated_capacity = 0x16f99c;
  spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._280_8_,
                      7.43605357848868e-318);
  (in_RDI->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_b8,&app.dataset,none,(error_code *)0x0);
  if (local_b8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_c8._M_dir._M_ptr = local_b8._M_dir._M_ptr;
    local_c8._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b8._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      local_c8._M_dir._M_ptr = local_b8._M_dir._M_ptr;
      local_c8._M_dir._M_refcount._M_pi = local_b8._M_dir._M_refcount._M_pi;
      if (local_b8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_0011097a;
    }
    else {
      (local_b8._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b8._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    local_c8._M_dir._M_ptr = local_b8._M_dir._M_ptr;
    local_c8._M_dir._M_refcount._M_pi = local_b8._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b8._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_b8._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8._M_dir._M_refcount._M_pi);
  }
LAB_0011097a:
  do {
    if (local_c8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00110b41:
      if (local_b8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8._M_dir._M_refcount._M_pi);
      }
      return in_RDI;
    }
    file = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_c8);
    if (app.type == 0) {
      bVar2 = is_db_file(file);
      if (bVar2) {
        if (spdlog::details::registry::instance()::s_instance == '\0') {
          iVar3 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
          if (iVar3 != 0) {
            spdlog::details::registry::registry
                      ((registry *)spdlog::details::registry::instance()::s_instance);
            __cxa_atexit(spdlog::details::registry::~registry,
                         spdlog::details::registry::instance()::s_instance,&__dso_handle);
            __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
          }
        }
        this = spdlog::details::registry::instance()::s_instance._280_8_;
        pcVar1 = (file->_M_pathname)._M_dataplus._M_p;
        local_a8._0_8_ = &local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,pcVar1,pcVar1 + (file->_M_pathname)._M_string_length);
        local_80._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
        ;
        local_80._8_4_ = 0x102;
        local_80._16_8_ = "find_database_file";
        local_58._M_pathname._M_dataplus._M_p = "Found DB file {}";
        local_58._M_pathname._M_string_length = 0x10;
        loc._12_4_ = local_80._12_4_;
        loc.line = 0x102;
        loc.filename = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
        ;
        loc.funcname = "find_database_file";
        spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
                  ((logger *)this,loc,debug,(basic_string_view<char> *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ != &local_98) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
        }
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back(in_RDI,file);
      }
    }
    else {
      std::filesystem::absolute((path *)local_80);
      std::filesystem::__cxx11::path::lexically_normal();
      database_filename_abi_cxx11_();
      iVar3 = std::filesystem::__cxx11::path::compare((path *)local_a8);
      CLI::std::filesystem::__cxx11::path::~path(&local_58);
      CLI::std::filesystem::__cxx11::path::~path((path *)local_a8);
      CLI::std::filesystem::__cxx11::path::~path((path *)local_80);
      if (iVar3 == 0) {
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back(in_RDI,file);
        if (local_c8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8._M_dir._M_refcount._M_pi);
        }
        goto LAB_00110b41;
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_c8);
  } while( true );
}

Assistant:

std::vector<path>
find_database_file()
{
    SPDLOG_DEBUG("Looking for database file...");

    std::vector<path> ans;
    for (auto&& dir_entry : directory_iterator(app.dataset)) {
        if (app.type) {
            if (absolute(dir_entry.path()).lexically_normal() ==
                database_filename()) {
                ans.push_back(dir_entry.path());
                return ans;
            }
            continue;
        }

        if (is_db_file(dir_entry.path())) {
            SPDLOG_DEBUG("Found DB file {}", dir_entry.path().string());
            ans.push_back(dir_entry.path());
        }
    }

    return ans;
}